

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.hpp
# Opt level: O0

void vbytehuffzero::decode
               (uint8_t *in_ptr,size_t in_size_u8,uint32_t *out_ptr,size_t out_size_u32,uint8_t *buf
               )

{
  uint8_t *in_ptr_00;
  ulong __n;
  uint32_t *in_RCX;
  uint *in_RDI;
  void *in_R8;
  size_t compressed_size_1;
  uint32_t *in_ptr_u32_2;
  size_t compressed_size;
  uint32_t *in_ptr_u32_1;
  size_t i;
  size_t dst_capacity;
  size_t last_size;
  size_t num_blocks;
  size_t out_size;
  uint8_t *out_ptr_u8;
  size_t vbyte_bytes;
  uint32_t *in_ptr_u32;
  size_t in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  uint *in_stack_ffffffffffffff90;
  uint8_t *dst;
  void *local_40;
  uint *local_8;
  
  local_8 = in_RDI + 1;
  in_ptr_00 = (uint8_t *)(ulong)(*in_RDI >> 0x11);
  __n = (ulong)*in_RDI & 0x1ffff;
  local_40 = in_R8;
  for (dst = (uint8_t *)0x0; dst < in_ptr_00; dst = dst + 1) {
    in_stack_ffffffffffffff88 = (void *)(ulong)*local_8;
    in_stack_ffffffffffffff90 = local_8;
    if (in_stack_ffffffffffffff88 == (void *)0xffffffff) {
      memcpy(local_40,local_8 + 1,0x20000);
      local_8 = local_8 + 0x8001;
    }
    else {
      HUF_decompress(dst,(size_t)local_8,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      local_8 = (uint *)((long)in_stack_ffffffffffffff88 + 4 + (long)local_8);
    }
    local_40 = (void *)((long)local_40 + 0x20000);
  }
  if (__n != 0) {
    if (*local_8 == 0xffffffff) {
      memcpy(local_40,local_8 + 1,__n);
    }
    else {
      HUF_decompress(dst,(size_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(size_t)local_8
                    );
    }
  }
  vbyte::decode(in_ptr_00,__n,in_RCX,(size_t)dst,(uint8_t *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

static void decode(const uint8_t* in_ptr, size_t in_size_u8,
        uint32_t* out_ptr, size_t out_size_u32, uint8_t* buf = NULL)
    {
        auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_ptr);
        size_t vbyte_bytes = *in_ptr_u32;
        in_ptr += +sizeof(uint32_t);

        auto out_ptr_u8 = reinterpret_cast<uint8_t*>(buf);
        auto out_size = vbyte_bytes;
        auto num_blocks = out_size / HUF_BLOCKSIZE_MAX;
        auto last_size = out_size % HUF_BLOCKSIZE_MAX;
        auto dst_capacity = out_size_u32;
        for (size_t i = 0; i < num_blocks; i++) {
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_ptr);
            size_t compressed_size = *in_ptr_u32;
            if (compressed_size == 0xFFFFFFFF) { // not compressible just copy
                memcpy(out_ptr_u8, in_ptr + 4, HUF_BLOCKSIZE_MAX);
                in_ptr += HUF_BLOCKSIZE_MAX + 4;
            } else {
                HUF_decompress(
                    out_ptr_u8, HUF_BLOCKSIZE_MAX, in_ptr + 4, compressed_size);
                in_ptr += (compressed_size + 4);
            }
            out_ptr_u8 += HUF_BLOCKSIZE_MAX;
        }
        if (last_size) {
            auto in_ptr_u32 = reinterpret_cast<const uint32_t*>(in_ptr);
            size_t compressed_size = *in_ptr_u32;
            if (compressed_size == 0xFFFFFFFF) { // not compressible just copy
                memcpy(out_ptr_u8, in_ptr + 4, last_size);
            } else {
                HUF_decompress(
                    out_ptr_u8, last_size, in_ptr + 4, compressed_size);
            }
        }
        vbyte::decode(buf, vbyte_bytes, out_ptr, out_size_u32);
    }